

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_7fba::test_art_iterator_next(void **param_1)

{
  unsigned_long uVar1;
  _Bool _Var2;
  allocator_type *__a;
  art_val_t *paVar3;
  size_t i_1;
  size_t i;
  ulong uVar4;
  pointer pVVar5;
  pointer pVVar6;
  size_t j;
  ulong uVar7;
  long lVar8;
  initializer_list<unsigned_long> __l;
  initializer_list<std::array<unsigned_char,_6UL>_> __l_00;
  initializer_list<(anonymous_namespace)::Value> __l_01;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> keys;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  art_iterator_t iterator;
  
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keys.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iterator.depth = '0';
  iterator.frame = '\0';
  iterator._18_6_ = 0;
  iterator.frames[0].node._0_2_ = 0x100;
  iterator.frames[0].node._2_6_ = 0;
  iterator.key[0] = '\x04';
  iterator.key[1] = '\0';
  iterator.key[2] = '\0';
  iterator.key[3] = '\0';
  iterator.key[4] = '\0';
  iterator.key[5] = '\0';
  iterator._6_2_ = 0;
  iterator.value = (art_val_t *)0x10;
  __l._M_len = 4;
  __l._M_array = (iterator)&iterator;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sizes,__l,(allocator_type *)&art);
  for (uVar4 = 0;
      pVVar5 = values.
               super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    uVar1 = sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    paVar3 = (art_val_t *)0x0;
    for (uVar7 = 0; (byte)uVar1 != uVar7; uVar7 = uVar7 + 1) {
      iterator.key = (art_key_chunk_t  [6])((uint6)CONCAT11((char)uVar7,(char)uVar4) << 0x18);
      std::vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>::
      emplace_back<std::array<unsigned_char,6ul>>
                ((vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
                  *)&keys,(array<unsigned_char,_6UL> *)&iterator);
      iterator.value = paVar3;
      std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
      push_back(&values,(value_type *)&iterator);
      paVar3 = (art_val_t *)((long)paVar3->key + uVar4);
    }
  }
  art.root = (art_node_t *)0x0;
  lVar8 = 0;
  pVVar6 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)keys.
                             super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.
                            super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 6); uVar4 = uVar4 + 1) {
    art_insert((art_t *)&art,
               (keys.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8,(art_val_t *)pVVar6);
    assert_art_valid(&art);
    pVVar6 = pVVar6 + 1;
    lVar8 = lVar8 + 6;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  lVar8 = 0;
  do {
    assert_key_eq((art_key_chunk_t *)&iterator,
                  (keys.
                   super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8);
    _assert_true((ulong)(pVVar5 == (pointer)iterator.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0xee);
    _Var2 = art_iterator_next((art_iterator_t *)&iterator);
    pVVar5 = pVVar5 + 1;
    lVar8 = lVar8 + 6;
  } while (_Var2);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::
  _Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  ~_Vector_base(&keys.
                 super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
               );
  iterator.frames[0].index_in_node = '\0';
  iterator.frames[0]._9_1_ = 0;
  iterator.frames[0]._10_6_ = 0x10000;
  iterator.frames[1].node._0_2_ = 0;
  iterator.depth = '\x01';
  iterator.frame = '\0';
  iterator._18_6_ = 0x1000000;
  iterator.frames[0].node._0_2_ = 0;
  iterator.frames[0].node._2_6_ = 0x10000000001;
  iterator.key[0] = '\0';
  iterator.key[1] = '\0';
  iterator.key[2] = '\0';
  iterator.key[3] = '\0';
  iterator.key[4] = '\0';
  iterator.key[5] = '\0';
  iterator._6_2_ = 0;
  iterator.value = (art_val_t *)0x1000000;
  __a = (allocator_type *)&values;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&iterator;
  std::vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  vector(&keys,__l_00,__a);
  iterator.value = (art_val_t *)0x0;
  iterator.frames[0].node._0_2_ = 1;
  iterator.frames[0].node._2_6_ = 0;
  iterator.frames[1].node._0_2_ = 2;
  iterator.frames[1].node._2_6_ = 0;
  iterator.frames[2].node = (art_node_t *)0x3;
  iterator.frames[3].node = (art_node_t *)0x4;
  iterator.frames[4].node = (art_node_t *)0x5;
  iterator.frames[5].node = (art_node_t *)0x6;
  __l_01._M_len = 7;
  __l_01._M_array = (iterator)&iterator;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_01,(allocator_type *)__a);
  pVVar5 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar8 = 0;
  pVVar6 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)keys.
                             super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.
                            super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 6); uVar4 = uVar4 + 1) {
    art_insert((art_t *)&sizes,
               (keys.
                super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8,(art_val_t *)pVVar6);
    assert_art_valid((art_t *)&sizes);
    pVVar6 = pVVar6 + 1;
    lVar8 = lVar8 + 6;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&sizes,true);
  lVar8 = 0;
  do {
    assert_key_eq((art_key_chunk_t *)&iterator,
                  (keys.
                   super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8);
    _assert_true((ulong)(pVVar5 == (pointer)iterator.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x105);
    _Var2 = art_iterator_next((art_iterator_t *)&iterator);
    pVVar5 = pVVar5 + 1;
    lVar8 = lVar8 + 6;
  } while (_Var2);
  art_free((art_t *)&sizes);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::
  _Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  ~_Vector_base(&keys.
                 super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
               );
  return;
}

Assistant:

void erase(Key key) {
        art_erase(&art_, key.data());
        shadow_.erase(key);
    }